

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::RenderDeviceVkImpl::~RenderDeviceVkImpl(RenderDeviceVkImpl *this)

{
  RenderPassCache *this_00;
  IDXCompiler *pIVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  VulkanPhysicalDevice *__ptr;
  VulkanMemoryManager *this_01;
  VulkanDynamicMemoryManager *this_02;
  RenderDeviceVkImpl *this_03;
  __node_base *p_Var3;
  string msg;
  string local_88;
  _Hashtable<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_68;
  DescriptorPoolManager *local_60;
  DescriptorSetAllocator *local_58;
  unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_> *local_50;
  VulkanMemoryManager *local_48;
  VulkanDynamicMemoryManager *local_40;
  RenderDeviceVkImpl *local_38;
  
  VulkanDynamicMemoryManager::Destroy(&this->m_DynamicMemoryManager);
  this_00 = (this->m_ImplicitRenderPassCache)._M_t.
            super___uniq_ptr_impl<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
            ._M_t.
            super__Tuple_impl<0UL,_Diligent::RenderPassCache_*,_std::default_delete<Diligent::RenderPassCache>_>
            .super__Head_base<0UL,_Diligent::RenderPassCache_*,_false>._M_head_impl;
  if (this_00 != (RenderPassCache *)0x0) {
    RenderPassCache::Destroy(this_00);
  }
  IdleGPU(this);
  VulkanUtilities::VulkanMemoryManager::ShrinkMemory(&this->m_MemoryMgr);
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::PurgeReleaseQueues
            (&this->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ,true);
  if (*(int *)&(this->m_DescriptorSetAllocator).super_DescriptorPoolManager.field_0xc4 != 0) {
    FormatString<char[59]>
              (&local_88,(char (*) [59])"All allocated descriptor sets must have been released now."
              );
    DebugAssertionFailed
              (local_88._M_dataplus._M_p,"~RenderDeviceVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0xe3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_DynamicDescriptorPool).m_AllocatedPoolCounter.super___atomic_base<int>._M_i != 0) {
    FormatString<char[68]>
              (&local_88,
               (char (*) [68])"All allocated dynamic descriptor pools must have been released now.")
    ;
    DebugAssertionFailed
              (local_88._M_dataplus._M_p,"~RenderDeviceVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0xe4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_DynamicMemoryManager).super_MasterBlockListBasedManager.m_MasterBlockCounter.
      super___atomic_base<int>._M_i != 0) {
    FormatString<char[73]>
              (&local_88,
               (char (*) [73])
               "All allocated dynamic master blocks must have been returned to the pool.");
    DebugAssertionFailed
              (local_88._M_dataplus._M_p,"~RenderDeviceVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0xe5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  local_50 = &this->m_ImplicitRenderPassCache;
  local_58 = &this->m_DescriptorSetAllocator;
  local_60 = &this->m_DynamicDescriptorPool;
  local_68 = &(this->m_TransientCmdPoolMgrs)._M_h;
  p_Var3 = &(this->m_TransientCmdPoolMgrs)._M_h._M_before_begin;
  local_48 = &this->m_MemoryMgr;
  local_40 = &this->m_DynamicMemoryManager;
  local_38 = this;
  while (this_03 = local_38, p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    if (*(int *)&p_Var3[0x1b]._M_nxt != 0) {
      FormatString<char[208]>
                (&local_88,
                 (char (*) [208])
                 "All allocated transient command pools must have been released now. If there are outstanding references to the pools in release queues, the app will crash when CommandPoolManager::FreeCommandPool() is called."
                );
      DebugAssertionFailed
                (local_88._M_dataplus._M_p,"~RenderDeviceVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
                 ,0xea);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    CommandPoolManager::DestroyPools((CommandPoolManager *)(p_Var3 + 2));
  }
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::DestroyCommandQueues
            (&local_38->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            );
  this_02 = local_40;
  this_01 = local_48;
  pIVar1 = (this_03->m_pDxCompiler)._M_t.
           super___uniq_ptr_impl<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>
           ._M_t.
           super__Tuple_impl<0UL,_Diligent::IDXCompiler_*,_std::default_delete<Diligent::IDXCompiler>_>
           .super__Head_base<0UL,_Diligent::IDXCompiler_*,_false>._M_head_impl;
  if (pIVar1 != (IDXCompiler *)0x0) {
    (*pIVar1->_vptr_IDXCompiler[1])();
  }
  (this_03->m_pDxCompiler)._M_t.
  super___uniq_ptr_impl<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>._M_t.
  super__Tuple_impl<0UL,_Diligent::IDXCompiler_*,_std::default_delete<Diligent::IDXCompiler>_>.
  super__Head_base<0UL,_Diligent::IDXCompiler_*,_false>._M_head_impl = (IDXCompiler *)0x0;
  VulkanDynamicMemoryManager::~VulkanDynamicMemoryManager(this_02);
  VulkanUtilities::VulkanMemoryManager::~VulkanMemoryManager(this_01);
  std::
  vector<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
  ::~vector(&this_03->m_QueryMgrs);
  std::
  _Hashtable<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(local_68);
  DescriptorPoolManager::~DescriptorPoolManager(local_60);
  DescriptorSetAllocator::~DescriptorSetAllocator(local_58);
  std::unique_ptr<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>::
  ~unique_ptr(local_50);
  std::unique_ptr<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>::
  ~unique_ptr(&this_03->m_FramebufferCache);
  p_Var2 = (this_03->m_LogicalVkDevice).
           super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  __ptr = (this_03->m_PhysicalDevice)._M_t.
          super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
          ._M_t.
          super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
          .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  if (__ptr != (VulkanPhysicalDevice *)0x0) {
    std::default_delete<VulkanUtilities::VulkanPhysicalDevice>::operator()
              ((default_delete<VulkanUtilities::VulkanPhysicalDevice> *)&this_03->m_PhysicalDevice,
               __ptr);
  }
  (this_03->m_PhysicalDevice)._M_t.
  super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
  ._M_t.
  super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
  .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl =
       (VulkanPhysicalDevice *)0x0;
  p_Var2 = (this_03->m_VulkanInstance).
           super___shared_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::~RenderDeviceNextGenBase
            (&this_03->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            );
  return;
}

Assistant:

RenderDeviceVkImpl::~RenderDeviceVkImpl()
{
    // Explicitly destroy dynamic heap. This will move resources owned by
    // the heap into release queues
    m_DynamicMemoryManager.Destroy();

    // Explicitly destroy render pass cache
    if (m_ImplicitRenderPassCache)
    {
        m_ImplicitRenderPassCache->Destroy();
    }

    // Wait for the GPU to complete all its operations
    IdleGPU();

    ReleaseStaleResources(true);

    DEV_CHECK_ERR(m_DescriptorSetAllocator.GetAllocatedDescriptorSetCounter() == 0, "All allocated descriptor sets must have been released now.");
    DEV_CHECK_ERR(m_DynamicDescriptorPool.GetAllocatedPoolCounter() == 0, "All allocated dynamic descriptor pools must have been released now.");
    DEV_CHECK_ERR(m_DynamicMemoryManager.GetMasterBlockCounter() == 0, "All allocated dynamic master blocks must have been returned to the pool.");

    // Immediately destroys all command pools
    for (auto& CmdPool : m_TransientCmdPoolMgrs)
    {
        DEV_CHECK_ERR(CmdPool.second.GetAllocatedPoolCount() == 0, "All allocated transient command pools must have been released now. If there are outstanding references to the pools in release queues, the app will crash when CommandPoolManager::FreeCommandPool() is called.");
        CmdPool.second.DestroyPools();
    }

    // We must destroy command queues explicitly prior to releasing Vulkan device
    DestroyCommandQueues();

    //if(m_PhysicalDevice)
    //{
    //    // If m_PhysicalDevice is empty, the device does not own vulkan logical device and must not
    //    // destroy it
    //    vkDestroyDevice(m_VkDevice, m_VulkanInstance->GetVkAllocator());
    //}
}